

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int bc_get_leb128(BCReaderState *s,uint32_t *pval)

{
  uint uVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  
  if (s->ptr < s->buf_end) {
    iVar5 = 1;
    bVar4 = 0;
    uVar6 = 0;
    pbVar2 = s->ptr;
    do {
      pbVar3 = pbVar2 + 1;
      uVar6 = (*pbVar2 & 0x7f) << (bVar4 & 0x1f) | uVar6;
      if (-1 < (char)*pbVar2) {
        *pval = uVar6;
        if (-1 < iVar5) {
          s->ptr = pbVar3;
          return 0;
        }
        goto LAB_0013b9bb;
      }
      uVar1 = iVar5 - 1;
      iVar5 = iVar5 + 1;
      bVar4 = bVar4 + 7;
      pbVar2 = pbVar3;
    } while (pbVar3 < s->buf_end && uVar1 < 4);
  }
  *pval = 0;
LAB_0013b9bb:
  bc_get_leb128_cold_1();
  return -1;
}

Assistant:

static int bc_get_leb128(BCReaderState *s, uint32_t *pval)
{
    int ret;
    ret = get_leb128(pval, s->ptr, s->buf_end);
    if (unlikely(ret < 0))
        return bc_read_error_end(s);
    s->ptr += ret;
    return 0;
}